

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int send_finished(ptls_t *tls,ptls_message_emitter_t *emitter)

{
  long *src;
  long lVar1;
  int iVar2;
  uint8_t *msg;
  long *in_RSI;
  long in_RDI;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  size_t mess_start;
  ptls_key_schedule_t *_key_sched;
  ptls_buffer_t *_buf;
  ptls_message_emitter_t *_emitter;
  int ret;
  size_t in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffa0;
  long *delta;
  ptls_buffer_t *in_stack_ffffffffffffffa8;
  ptls_key_schedule_t *sched;
  long lVar3;
  int local_14;
  
  local_14 = (*(code *)in_RSI[3])(in_RSI);
  if (local_14 == 0) {
    src = (long *)*in_RSI;
    lVar1 = *(long *)(in_RDI + 0x50);
    local_14 = ptls_buffer__do_pushv
                         (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                          in_stack_ffffffffffffff98);
    if (local_14 == 0) {
      lVar3 = 3;
      delta = src;
      local_14 = ptls_buffer__do_pushv(in_stack_ffffffffffffffa8,src,3);
      if (local_14 == 0) {
        sched = (ptls_key_schedule_t *)src[2];
        local_14 = ptls_buffer_reserve(in_stack_ffffffffffffffa8,(size_t)delta);
        if ((local_14 == 0) &&
           (local_14 = calc_verify_data(_emitter,(ptls_key_schedule_t *)_buf,_key_sched),
           local_14 == 0)) {
          *(long *)(*in_RSI + 0x10) =
               *(long *)(*(long *)(*(long *)(in_RDI + 0x50) + 0x58) + 8) + *(long *)(*in_RSI + 0x10)
          ;
          msg = (uint8_t *)(src[2] - (long)sched);
          if (lVar3 == -1) {
            iVar2 = ptls_buffer__adjust_quic_blocksize
                              ((ptls_buffer_t *)0xffffffffffffffff,(size_t)sched);
            if (iVar2 != 0) {
              return iVar2;
            }
          }
          else {
            for (; lVar3 != 0; lVar3 = lVar3 + -1) {
              *(char *)((long)sched + (*src - lVar3)) =
                   (char)((ulong)msg >> (((char)lVar3 + -1) * '\b' & 0x3fU));
            }
          }
          if (lVar1 != 0) {
            ptls__key_schedule_update_hash(sched,msg,(size_t)delta);
          }
          local_14 = (*(code *)in_RSI[4])(in_RSI);
        }
      }
    }
  }
  return local_14;
}

Assistant:

static int send_finished(ptls_t *tls, ptls_message_emitter_t *emitter)
{
    int ret;

    ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_FINISHED, {
        if ((ret = ptls_buffer_reserve(emitter->buf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
            goto Exit;
        if ((ret = calc_verify_data(emitter->buf->base + emitter->buf->off, tls->key_schedule,
                                    tls->traffic_protection.enc.secret)) != 0)
            goto Exit;
        emitter->buf->off += tls->key_schedule->hashes[0].algo->digest_size;
    });

Exit:
    return ret;
}